

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CloseCurrentPopup(void)

{
  int iVar1;
  ImGuiPopupRef *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  pIVar4 = GImGui;
  iVar1 = (GImGui->BeginPopupStack).Size;
  uVar5 = (ulong)iVar1;
  if ((0 < (long)uVar5) && (iVar1 <= (GImGui->OpenPopupStack).Size)) {
    uVar7 = uVar5 - 1;
    pIVar2 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar7].PopupId == pIVar2[uVar7].PopupId) {
      if (iVar1 != 1) {
        do {
          iVar1 = (int)uVar5;
          uVar6 = iVar1 - 1;
          uVar5 = (ulong)uVar6;
          pIVar3 = pIVar2[uVar5].Window;
          if (pIVar3 == (ImGuiWindow *)0x0) {
            uVar7 = (ulong)(iVar1 - 1);
            goto LAB_00125524;
          }
          if ((pIVar3->Flags & 0x10000000) == 0) goto LAB_00125524;
          uVar7 = (ulong)((int)uVar7 - 1);
        } while (1 < (int)uVar6);
        uVar7 = 0;
      }
LAB_00125524:
      ClosePopupToLevel((int)uVar7,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}